

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O2

void greetable_skeleton_notify(GObject *object,GParamSpec *pspec)

{
  GType GVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  
  GVar1 = greetable_skeleton_get_type();
  lVar2 = g_type_check_instance_cast(object,GVar1);
  g_mutex_lock(*(long *)(lVar2 + 0x20) + 0x20);
  lVar5 = *(long *)(lVar2 + 0x20);
  if ((*(long *)(lVar5 + 8) != 0) && (*(long *)(lVar5 + 0x10) == 0)) {
    uVar3 = g_idle_source_new();
    *(undefined8 *)(*(long *)(lVar2 + 0x20) + 0x10) = uVar3;
    g_source_set_priority(uVar3,0);
    uVar3 = *(undefined8 *)(*(long *)(lVar2 + 0x20) + 0x10);
    uVar4 = g_object_ref(lVar2);
    g_source_set_callback(uVar3,_greetable_emit_changed,uVar4,g_object_unref);
    g_source_set_name(*(undefined8 *)(*(long *)(lVar2 + 0x20) + 0x10),
                      "[generated] _greetable_emit_changed");
    g_source_attach(*(undefined8 *)(*(long *)(lVar2 + 0x20) + 0x10),
                    *(undefined8 *)(*(long *)(lVar2 + 0x20) + 0x18));
    g_source_unref(*(undefined8 *)(*(long *)(lVar2 + 0x20) + 0x10));
    lVar5 = *(long *)(lVar2 + 0x20);
  }
  g_mutex_unlock(lVar5 + 0x20);
  return;
}

Assistant:

static void
greetable_skeleton_notify (GObject      *object,
  GParamSpec *pspec G_GNUC_UNUSED)
{
  GreetableSkeleton *skeleton = GREETABLE_SKELETON (object);
  g_mutex_lock (&skeleton->priv->lock);
  if (skeleton->priv->changed_properties != NULL &&
      skeleton->priv->changed_properties_idle_source == NULL)
    {
      skeleton->priv->changed_properties_idle_source = g_idle_source_new ();
      g_source_set_priority (skeleton->priv->changed_properties_idle_source, G_PRIORITY_DEFAULT);
      g_source_set_callback (skeleton->priv->changed_properties_idle_source, _greetable_emit_changed, g_object_ref (skeleton), (GDestroyNotify) g_object_unref);
      g_source_set_name (skeleton->priv->changed_properties_idle_source, "[generated] _greetable_emit_changed");
      g_source_attach (skeleton->priv->changed_properties_idle_source, skeleton->priv->context);
      g_source_unref (skeleton->priv->changed_properties_idle_source);
    }
  g_mutex_unlock (&skeleton->priv->lock);
}